

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.h
# Opt level: O0

void __thiscall absl::lts_20250127::cord_internal::CordRepBtree::AlignBegin(CordRepBtree *this)

{
  size_t sVar1;
  size_t sVar2;
  ulong end;
  ulong local_28;
  size_t i;
  size_t new_end;
  size_t delta;
  CordRepBtree *this_local;
  
  sVar1 = begin(this);
  if (sVar1 != 0) {
    sVar2 = CordRepBtree::end(this);
    end = sVar2 - sVar1;
    set_begin(this,0);
    set_end(this,end);
    if (6 < end) {
      __assert_fail("new_end <= kMaxCapacity",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                    ,0x2e3,"void absl::cord_internal::CordRepBtree::AlignBegin()");
    }
    for (local_28 = 0; local_28 < end; local_28 = local_28 + 1) {
      this->edges_[local_28] = this->edges_[local_28 + sVar1];
    }
  }
  return;
}

Assistant:

inline void CordRepBtree::AlignBegin() {
  // The below code itself does not need to be fast as typically we have
  // mono-directional append/prepend calls, and `begin` / `end` are typically
  // adjusted no more than once. But we want to avoid potential register clobber
  // effects, making the compiler emit register save/store/spills, and minimize
  // the size of code.
  const size_t delta = begin();
  if (ABSL_PREDICT_FALSE(delta != 0)) {
    const size_t new_end = end() - delta;
    set_begin(0);
    set_end(new_end);
    // TODO(mvels): we can write this using 2 loads / 2 stores depending on
    // total size for the kMaxCapacity = 6 case. I.e., we can branch (switch) on
    // size, and then do overlapping load/store of up to 4 pointers (inlined as
    // XMM, YMM or ZMM load/store) and up to 2 pointers (XMM / YMM), which is a)
    // compact and b) not clobbering any registers.
    ABSL_ASSUME(new_end <= kMaxCapacity);
#ifdef __clang__
#pragma unroll 1
#endif
    for (size_t i = 0; i < new_end; ++i) {
      edges_[i] = edges_[i + delta];
    }
  }
}